

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

size_t mqtt_decode_len(uchar *buf,size_t buflen,size_t *lenbytes)

{
  byte local_39;
  ulong uStack_38;
  uchar encoded;
  size_t i;
  size_t mult;
  size_t len;
  size_t *lenbytes_local;
  size_t buflen_local;
  uchar *buf_local;
  
  mult = 0;
  i = 1;
  local_39 = 0x80;
  for (uStack_38 = 0; uStack_38 < buflen && (local_39 & 0x80) != 0; uStack_38 = uStack_38 + 1) {
    local_39 = buf[uStack_38];
    mult = (long)(int)(local_39 & 0x7f) * i + mult;
    i = i << 7;
  }
  if (lenbytes != (size_t *)0x0) {
    *lenbytes = uStack_38;
  }
  return mult;
}

Assistant:

static size_t mqtt_decode_len(unsigned char *buf,
                              size_t buflen, size_t *lenbytes)
{
  size_t len = 0;
  size_t mult = 1;
  size_t i;
  unsigned char encoded = 128;

  for(i = 0; (i < buflen) && (encoded & 128); i++) {
    encoded = buf[i];
    len += (encoded & 127) * mult;
    mult *= 128;
  }

  if(lenbytes)
    *lenbytes = i;

  return len;
}